

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_send_flight_completed(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  byte bVar2;
  
  uVar1 = ssl->conf->hs_timeout_min;
  ssl->handshake->retransmit_timeout = uVar1;
  if (ssl->f_set_timer != (mbedtls_ssl_set_timer_t *)0x0) {
    (*ssl->f_set_timer)(ssl->p_timer,uVar1 >> 2,uVar1);
  }
  bVar2 = 2;
  if (ssl->in_msgtype == 0x16) {
    bVar2 = *ssl->in_msg == '\x14' | 2;
  }
  ssl->handshake->retransmit_state = bVar2;
  return;
}

Assistant:

void mbedtls_ssl_send_flight_completed( mbedtls_ssl_context *ssl )
{
    ssl_reset_retransmit_timeout( ssl );
    ssl_set_timer( ssl, ssl->handshake->retransmit_timeout );

    if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msg[0] == MBEDTLS_SSL_HS_FINISHED )
    {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    }
    else
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;
}